

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O1

void __thiscall Js::JavascriptMap::SetOnComplexVarMap(JavascriptMap *this,Var key,Var value)

{
  WriteBarrierPtr<void> *pWVar1;
  Type *addr;
  code *pcVar2;
  MapDataNode *pMVar3;
  bool bVar4;
  undefined4 *puVar5;
  Recycler *recycler;
  undefined1 local_78 [8];
  MapDataKeyValuePair pair;
  WriteBarrierPtr<void> local_60;
  WriteBarrierPtr<void> local_58;
  WriteBarrierPtr<void> local_50;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *local_48;
  MapDataNode *newNode;
  MapDataNode *node;
  Var key_local;
  
  node = (MapDataNode *)key;
  if (this->kind != ComplexVarMap) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x232,"(this->kind == MapKind::ComplexVarMap)",
                                "this->kind == MapKind::ComplexVarMap");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  newNode = (MapDataNode *)0x0;
  bVar4 = JsUtil::
          BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->u,&node,&newNode);
  pMVar3 = node;
  if (bVar4) {
    pWVar1 = &pair.value;
    Memory::Recycler::WBSetBit((char *)pWVar1);
    pair.value.ptr = pMVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60.ptr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                 local_78,pWVar1,&local_60);
    pMVar3 = newNode;
    addr = &newNode->data;
    Memory::Recycler::WBSetBit((char *)addr);
    (pMVar3->data).key.ptr = (void *)local_78;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pWVar1 = &(pMVar3->data).value;
    Memory::Recycler::WBSetBit((char *)pWVar1);
    (pMVar3->data).value.ptr = pair.key.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar1);
  }
  else {
    Memory::Recycler::WBSetBit((char *)&local_58);
    local_58.ptr = pMVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
    Memory::Recycler::WBSetBit((char *)&local_50);
    local_50.ptr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                 local_78,&local_58,&local_50);
    recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
    local_48 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
               ::Append(&this->list,
                        (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>
                         *)local_78,recycler);
    JsUtil::
    BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->u,&node,&local_48);
  }
  return;
}

Assistant:

void
JavascriptMap::SetOnComplexVarMap(Var key, Var value)
{
    Assert(this->kind == MapKind::ComplexVarMap);

    MapDataNode* node = nullptr;
    if (this->u.complexVarMap->TryGetValue(key, &node))
    {
        node->data = MapDataKeyValuePair(key, value);
        return;
    }

    MapDataKeyValuePair pair(key, value);
    MapDataNode* newNode = this->list.Append(pair, this->GetRecycler());
    this->u.complexVarMap->Add(key, newNode);
}